

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Scl_Tree_t * Scl_LibertyStart(char *pFileName)

{
  int nContents;
  int iVar1;
  char *pHead;
  Scl_Tree_t *pSVar2;
  char *pcVar3;
  size_t sVar4;
  char *__dest;
  Scl_Item_t *pSVar5;
  Vec_Str_t *pVVar6;
  abctime aVar7;
  long lVar8;
  timespec ts;
  timespec local_38;
  
  pcVar3 = pFileName;
  do {
    if (*pcVar3 == '>') {
      *pcVar3 = '\\';
    }
    else if (*pcVar3 == '\0') {
      nContents = Scl_LibertyFileSize(pFileName);
      if (nContents == 0) {
        pSVar2 = (Scl_Tree_t *)0x0;
      }
      else {
        pSVar2 = (Scl_Tree_t *)malloc(0x40);
        pSVar2->pFileName = (char *)0x0;
        pSVar2->pContents = (char *)0x0;
        pSVar2->nContents = 0;
        pSVar2->nLines = 0;
        pSVar2->nItems = 0;
        pSVar2->nItermAlloc = 0;
        pSVar2->pItems = (Scl_Item_t *)0x0;
        pSVar2->pError = (char *)0x0;
        pSVar2->clkStart = 0;
        pSVar2->vBuffer = (Vec_Str_t *)0x0;
        iVar1 = clock_gettime(3,&local_38);
        if (iVar1 < 0) {
          aVar7 = -1;
        }
        else {
          aVar7 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
        }
        pSVar2->clkStart = aVar7;
        pSVar2->nContents = nContents;
        pcVar3 = Scl_LibertyFileContents(pFileName,nContents);
        pSVar2->pContents = pcVar3;
        if (pFileName == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar4 = strlen(pFileName);
          __dest = (char *)malloc(sVar4 + 1);
          strcpy(__dest,pFileName);
        }
        pSVar2->pFileName = __dest;
        if (nContents < 1) {
          iVar1 = 10;
        }
        else {
          lVar8 = 0;
          iVar1 = 0;
          do {
            iVar1 = iVar1 + (uint)(pcVar3[lVar8] == ':' || pcVar3[lVar8] == '(');
            lVar8 = lVar8 + 1;
          } while (nContents != lVar8);
          iVar1 = iVar1 + 10;
        }
        pSVar2->nItermAlloc = iVar1;
        pSVar5 = (Scl_Item_t *)calloc((long)iVar1,0x28);
        pSVar2->pItems = pSVar5;
        pSVar2->nLines = 1;
        pSVar2->nItems = 0;
        pVVar6 = (Vec_Str_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        pcVar3 = (char *)malloc(0x10);
        pVVar6->pArray = pcVar3;
        pVVar6->nSize = 10;
        pcVar3[8] = '\0';
        pcVar3[9] = '\0';
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        pSVar2->vBuffer = pVVar6;
      }
      return pSVar2;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

Scl_Tree_t * Scl_LibertyStart( char * pFileName )
{
    Scl_Tree_t * p;
    int RetValue;
    // read the file into the buffer
    Scl_LibertyFixFileName( pFileName );
    RetValue = Scl_LibertyFileSize( pFileName );
    if ( RetValue == 0 )
        return NULL;
    // start the manager
    p = ABC_ALLOC( Scl_Tree_t, 1 );
    memset( p, 0, sizeof(Scl_Tree_t) );
    p->clkStart  = Abc_Clock();
    p->nContents = RetValue;
    p->pContents = Scl_LibertyFileContents( pFileName, p->nContents );
    // other 
    p->pFileName = Abc_UtilStrsav( pFileName );
    p->nItermAlloc = 10 + Scl_LibertyCountItems( p->pContents, p->pContents+p->nContents );
    p->pItems = ABC_CALLOC( Scl_Item_t, p->nItermAlloc );
    p->nItems = 0;
    p->nLines = 1;
    p->vBuffer = Vec_StrStart( 10 );
    return p;
}